

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall EqualArea_RemapEdges_Test::TestBody(EqualArea_RemapEdges_Test *this)

{
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3c23d70a3e800000,(Point2f)0xbc23d70a3e800000
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3c23d70a3f63d70a,(Point2f)0xbc23d70a3f63d70a
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3f7d70a43e800000,(Point2f)0x3f8147ae3e800000
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3f7d70a43f63d70a,(Point2f)0x3f8147ae3f63d70a
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3f28f5c33c23d70a,(Point2f)0x3f28f5c3bc23d70a
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3e19999a3c23d70a,(Point2f)0x3e19999abc23d70a
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3f28f5c33f7d70a4,(Point2f)0x3f28f5c33f8147ae
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3e19999a3f7d70a4,(Point2f)0x3e19999a3f8147ae
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3c23d70a3c23d70a,(Point2f)0xbc23d70abc23d70a
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3c23d70a3f7d70a4,(Point2f)0xbc23d70a3f8147ae
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3f7d70a43c23d70a,(Point2f)0x3f8147aebc23d70a
            );
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this,(Point2f)0x3f7d70a43f7d70a4,(Point2f)0x3f8147ae3f8147ae
            );
  return;
}

Assistant:

TEST(EqualArea, RemapEdges) {
    auto checkClose = [&](Point2f a, Point2f b) {
        Vector3f av = EqualAreaSquareToSphere(a);
        b = WrapEqualAreaSquare(b);
        Vector3f bv = EqualAreaSquareToSphere(b);
        EXPECT_GT(Dot(av, bv), .99);
    };

    checkClose(Point2f(.25, .01), Point2f(.25, -.01));
    checkClose(Point2f(.89, .01), Point2f(.89, -.01));

    checkClose(Point2f(.25, .99), Point2f(.25, 1.01));
    checkClose(Point2f(.89, .99), Point2f(.89, 1.01));

    checkClose(Point2f(.01, .66), Point2f(-.01, .66));
    checkClose(Point2f(.01, .15), Point2f(-.01, .15));

    checkClose(Point2f(.99, .66), Point2f(1.01, .66));
    checkClose(Point2f(.99, .15), Point2f(1.01, .15));

    checkClose(Point2f(.01, .01), Point2f(-.01, -.01));
    checkClose(Point2f(.99, .01), Point2f(1.01, -.01));
    checkClose(Point2f(.01, .99), Point2f(-.01, 1.01));
    checkClose(Point2f(.99, .99), Point2f(1.01, 1.01));
}